

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O1

void __thiscall
BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
          (BayesianGameIdenticalPayoff *this,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes,bool useSparseRewardModel)

{
  size_t sVar1;
  size_t sVar2;
  RewardModelMappingSparseMapped *this_00;
  undefined7 in_register_00000081;
  string local_70;
  string local_50;
  
  BayesianGameBase::BayesianGameBase((BayesianGameBase *)this,nrAgents,nrActions,nrTypes,0);
  (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameIdenticalPayoff_005a1350
  ;
  this->_m_utilFunction = (RewardModelDiscreteInterface *)0x0;
  this->_m_initialized = false;
  if ((int)CONCAT71(in_register_00000081,useSparseRewardModel) == 0) {
    this_00 = (RewardModelMappingSparseMapped *)operator_new(0x80);
    sVar1 = (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJTypes;
    sVar2 = (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJA;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"type","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ja","");
    RewardModelMapping::RewardModelMapping
              ((RewardModelMapping *)this_00,sVar1,sVar2,&local_50,&local_70);
  }
  else {
    this_00 = (RewardModelMappingSparseMapped *)operator_new(0x98);
    sVar1 = (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJTypes;
    sVar2 = (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJA;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"type","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ja","");
    RewardModelMappingSparseMapped::RewardModelMappingSparseMapped
              (this_00,sVar1,sVar2,&local_50,&local_70);
  }
  this->_m_utilFunction = (RewardModelDiscreteInterface *)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff(size_t nrAgents, 
                                                         const vector<size_t>& nrActions, 
                                                         const vector<size_t>& nrTypes,
                                                         bool useSparseRewardModel) :
    BayesianGameIdenticalPayoffInterface(nrAgents, nrActions, nrTypes),
    _m_utilFunction(0)
{
    _m_initialized=false;

    if(useSparseRewardModel)
        _m_utilFunction=new RewardModelMappingSparseMapped(_m_nrJTypes, _m_nrJA, "type", "ja");
    else
        _m_utilFunction=new RewardModelMapping(_m_nrJTypes, _m_nrJA, "type", "ja");
}